

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall StringPieceUtilTestJoinStringPiece::Run(StringPieceUtilTestJoinStringPiece *this)

{
  Test *pTVar1;
  bool bVar2;
  vector<StringPiece,_std::allocator<StringPiece>_> empty_list;
  string input;
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a:b:c",(allocator<char> *)&empty_list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("a:b:c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x50,"\"a:b:c\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,'/');
  bVar2 = std::operator==("a/b/c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x51,"\"a/b/c\" == JoinStringPiece(list, \'/\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"",(allocator<char> *)&empty_list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x58,"\"\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  pTVar1 = g_current_test;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  JoinStringPiece_abi_cxx11_(&input,&empty_list,':');
  bVar2 = std::operator==("",&input);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x5e,"\"\" == JoinStringPiece(empty_list, \':\')");
  std::__cxx11::string::~string((string *)&input);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a",(allocator<char> *)&empty_list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x65,"\"a\" == JoinStringPiece(single_list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,":a:b:c:",(allocator<char> *)&empty_list);
  SplitStringPiece(&list,(StringPiece)input._0_16_,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==(":a:b:c:",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x6c,"\":a:b:c:\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

TEST(StringPieceUtilTest, JoinStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ("a:b:c", JoinStringPiece(list, ':'));
    EXPECT_EQ("a/b/c", JoinStringPiece(list, '/'));
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ("", JoinStringPiece(list, ':'));
  }

  {
    vector<StringPiece> empty_list;

    EXPECT_EQ("", JoinStringPiece(empty_list, ':'));
  }

  {
    string one("a");
    vector<StringPiece> single_list = SplitStringPiece(one, ':');

    EXPECT_EQ("a", JoinStringPiece(single_list, ':'));
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(":a:b:c:", JoinStringPiece(list, ':'));
  }
}